

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O0

void __thiscall
Refal2::CVariablesBuilder::errorTypesNotMatched
          (CVariablesBuilder *this,char name,TVariableType type)

{
  allocator local_b9;
  string local_b8 [32];
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  TVariableType local_18;
  char local_11;
  TVariableType type_local;
  char name_local;
  CVariablesBuilder *this_local;
  
  local_18 = type;
  local_11 = name;
  _type_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,1,name,&local_b9);
  std::operator+((char *)local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"variable `");
  std::operator+(local_78,(char *)local_98);
  convertVariableTypeToTag(local_18);
  std::operator+(local_58,(char *)local_78);
  std::operator+(local_38,(char *)local_58);
  error(this,local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  return;
}

Assistant:

void CVariablesBuilder::errorTypesNotMatched( char name, TVariableType type )
{
	error( "variable `" + std::string( 1, name )
		+ "` previously defined in rule with type `"
		+ convertVariableTypeToTag( type ) + "`" );
}